

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_set.hpp
# Opt level: O1

bool __thiscall
cappuccino::
ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                  time_point expire_time,allow a)

{
  list<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
  *this_00;
  long lVar1;
  iterator iVar2;
  uint unaff_EBX;
  __off64_t *in_R8;
  size_t in_R9;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::keyed_element>_>_>
          ::find(&(this->m_keyed_elements)._M_t,key);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,expire_time);
  }
  else {
    if ((a & update) == 0) {
      return false;
    }
    lVar1 = *(long *)(iVar2._M_node + 2);
    ((duration *)(lVar1 + 0x10))->__r = (rep)expire_time.__d.__r;
    this_00 = &this->m_ttl_list;
    std::__cxx11::
    list<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
    ::splice(this_00,(int)this_00,(__off64_t *)this_00,(int)lVar1,in_R8,in_R9,unaff_EBX);
    *(_List_node_base **)(iVar2._M_node + 2) =
         (this->m_ttl_list).
         super__List_base<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::ttl_element>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
  }
  return true;
}

Assistant:

auto do_insert_update(const key_type& key, std::chrono::steady_clock::time_point expire_time, allow a) -> bool
    {
        const auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, expire_time);
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, expire_time);
                return true;
            }
        }
        return false;
    }